

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O2

void __thiscall
cppcms::mount_point::mount_point
          (mount_point *this,selection_type sel,string *non,string *selected,int group)

{
  regex *this_00;
  regex *this_01;
  regex local_40 [8];
  regex *local_38;
  
  booster::regex::regex(&this->host_);
  local_38 = &this->script_name_;
  booster::regex::regex(local_38);
  this_00 = &this->path_info_;
  booster::regex::regex(this_00);
  this_01 = local_38;
  this->group_ = group;
  this->selection_ = sel;
  (this->d).ptr_ = (_data *)0x0;
  if (sel == match_path_info) {
    booster::regex::regex(local_40,(string *)selected,0);
    booster::regex::operator=(this_00,local_40);
    booster::regex::~regex(local_40);
    booster::regex::regex(local_40,(string *)non,0);
    booster::regex::operator=(this_01,local_40);
  }
  else {
    booster::regex::regex(local_40,(string *)selected,0);
    booster::regex::operator=(this_01,local_40);
    booster::regex::~regex(local_40);
    booster::regex::regex(local_40,(string *)non,0);
    booster::regex::operator=(this_00,local_40);
  }
  booster::regex::~regex(local_40);
  return;
}

Assistant:

mount_point::mount_point(mount_point::selection_type sel,std::string const &non,std::string const &selected,int group) :
	group_(group),
	selection_(sel)
{
	if(sel == match_path_info) {
		path_info_ = booster::regex(selected);
		script_name_ = booster::regex(non);
	}
	else {
		script_name_ = booster::regex(selected);
		path_info_ = booster::regex(non);
	}
}